

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  iterator iVar1;
  pointer pbVar2;
  int i;
  int iVar3;
  float grow;
  float fVar4;
  size_t bucket_count;
  float shrink_threshold;
  AssertionResult gtest_ar;
  TypeParam ht;
  AssertHelper local_180;
  float local_174;
  string local_170;
  long *local_150;
  int local_148;
  float local_144;
  pair<google::sparse_hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_140;
  undefined1 local_f0 [104];
  size_type local_88;
  long *local_48;
  size_type local_40;
  
  this_00 = (sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
             *)(local_f0 + 8);
  local_174 = 0.2;
  do {
    local_170._M_dataplus._M_p = (pointer)0x0;
    local_170._M_string_length._0_4_ = 0;
    local_150 = (long *)0x0;
    local_148 = 0;
    local_140.first.ht._0_4_ = 0;
    local_140.first.pos.row_begin._M_current =
         (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
          *)0x0;
    local_f0._0_8_ = &PTR__BaseHashtableInterface_00c25438;
    google::
    sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::sparse_hashtable(this_00,0,(Hasher *)&local_170,(Hasher *)&local_150,(Capital *)&local_180,
                       (SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>
                        *)&local_144,
                       (Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                        *)&local_140);
    local_f0._0_8_ = &PTR__BaseHashtableInterface_00c253b8;
    HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((key_type *)&local_140,
                (HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)this,1);
    google::
    sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::squash_deleted(this_00);
    local_f0[0x32] = true;
    std::__cxx11::string::_M_assign((string *)(local_f0 + 0x48));
    if ((iterator *)CONCAT44(local_140.first.ht._4_4_,local_140.first.ht._0_4_) !=
        &local_140.first.pos.row_end) {
      operator_delete((undefined1 *)CONCAT44(local_140.first.ht._4_4_,local_140.first.ht._0_4_));
    }
    local_f0._44_4_ = local_174 * 0.5;
    local_f0._40_4_ = local_174;
    fVar4 = local_174 * (float)local_48;
    local_f0._24_8_ = (undefined8)fVar4;
    local_f0._24_8_ = (long)(fVar4 - 9.223372e+18) & (long)local_f0._24_8_ >> 0x3f | local_f0._24_8_
    ;
    local_f0[0x30] = false;
    if (0.0 <= (float)local_f0._44_4_) {
      local_f0._44_4_ = 0.0;
    }
    fVar4 = (float)local_f0._44_4_ * (float)local_48;
    local_f0._32_8_ = (undefined8)fVar4;
    local_f0._32_8_ = (long)(fVar4 - 9.223372e+18) & (long)local_f0._32_8_ >> 0x3f | local_f0._32_8_
    ;
    local_170._M_dataplus._M_p._0_4_ = local_174;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_140,"grow_threshold","ht.max_load_factor()",&local_174,
               (float *)&local_170);
    if ((char)local_140.first.ht == '\0') {
      testing::Message::Message((Message *)&local_170);
      pbVar2 = (pointer)0xafc493;
      if (local_140.first.pos.row_begin._M_current !=
          (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        pbVar2 = (local_140.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x269,(char *)pbVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,(Message *)&local_170);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
      if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
      }
    }
    iVar1._M_current = local_140.first.pos.row_begin._M_current;
    if (local_140.first.pos.row_begin._M_current !=
        (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((local_140.first.pos.row_begin._M_current)->group !=
          (pointer)&((local_140.first.pos.row_begin._M_current)->settings).
                    super_alloc_impl<Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                    .
                    super_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                    .count_) {
        operator_delete((local_140.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar1._M_current);
    }
    local_170._M_dataplus._M_p = (pointer)0x0;
    local_150 = (long *)CONCAT44(local_150._4_4_,local_f0._44_4_);
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_140,"0.0","ht.min_load_factor()",(double *)&local_170,
               (float *)&local_150);
    if ((char)local_140.first.ht == '\0') {
      testing::Message::Message((Message *)&local_170);
      pbVar2 = (pointer)0xafc493;
      if (local_140.first.pos.row_begin._M_current !=
          (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        pbVar2 = (local_140.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x26a,(char *)pbVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,(Message *)&local_170);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
      if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
      }
    }
    iVar1._M_current = local_140.first.pos.row_begin._M_current;
    if (local_140.first.pos.row_begin._M_current !=
        (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((local_140.first.pos.row_begin._M_current)->group !=
          (pointer)&((local_140.first.pos.row_begin._M_current)->settings).
                    super_alloc_impl<Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                    .
                    super_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                    .count_) {
        operator_delete((local_140.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar1._M_current);
    }
    google::
    sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::resize(this_00,0x4098);
    local_150 = local_48;
    UniqueObjectHelper<std::__cxx11::string>(&local_170,2);
    google::
    sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(this_00,1);
    google::
    sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize(&local_140,this_00,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((key_type *)&local_140,
                (HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)this,2);
    google::
    sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::erase(this_00,(key_type *)&local_140);
    if ((iterator *)CONCAT44(local_140.first.ht._4_4_,local_140.first.ht._0_4_) !=
        &local_140.first.pos.row_end) {
      operator_delete((undefined1 *)CONCAT44(local_140.first.ht._4_4_,local_140.first.ht._0_4_));
    }
    iVar3 = 2;
    while( true ) {
      UniqueObjectHelper<std::__cxx11::string>(&local_170,iVar3);
      google::
      sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
      ::resize_delta(this_00,1);
      google::
      sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
      ::insert_noresize(&local_140,this_00,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if (local_174 <= (float)(local_40 - local_88) / (float)local_150) break;
      local_170._M_dataplus._M_p = (pointer)local_48;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_140,"bucket_count","ht.bucket_count()",
                 (unsigned_long *)&local_150,(unsigned_long *)&local_170);
      if ((char)local_140.first.ht == '\0') {
        testing::Message::Message((Message *)&local_170);
        pbVar2 = (pointer)0xafc493;
        if (local_140.first.pos.row_begin._M_current !=
            (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
             *)0x0) {
          pbVar2 = (local_140.first.pos.row_begin._M_current)->group;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x275,(char *)pbVar2);
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
        }
      }
      iVar1._M_current = local_140.first.pos.row_begin._M_current;
      if (local_140.first.pos.row_begin._M_current !=
          (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        if ((local_140.first.pos.row_begin._M_current)->group !=
            (pointer)&((local_140.first.pos.row_begin._M_current)->settings).
                      super_alloc_impl<Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                      .
                      super_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                      .count_) {
          operator_delete((local_140.first.pos.row_begin._M_current)->group);
        }
        operator_delete(iVar1._M_current);
      }
      iVar3 = iVar3 + 1;
    }
    local_170._M_dataplus._M_p = (pointer)local_48;
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((internal *)&local_140,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_170
               ,(unsigned_long *)&local_150);
    if ((char)local_140.first.ht == '\0') {
      testing::Message::Message((Message *)&local_170);
      pbVar2 = (pointer)0xafc493;
      if (local_140.first.pos.row_begin._M_current !=
          (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        pbVar2 = (local_140.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x277,(char *)pbVar2);
      testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
      }
    }
    iVar1._M_current = local_140.first.pos.row_begin._M_current;
    if (local_140.first.pos.row_begin._M_current !=
        (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((local_140.first.pos.row_begin._M_current)->group !=
          (pointer)&((local_140.first.pos.row_begin._M_current)->settings).
                    super_alloc_impl<Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                    .
                    super_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                    .count_) {
        operator_delete((local_140.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar1._M_current);
    }
    fVar4 = (float)local_48;
    local_144 = (float)(local_40 - local_88) / fVar4 + -0.01;
    local_f0._44_4_ = 0.5;
    if (local_144 <= 0.5) {
      local_f0._44_4_ = local_144;
    }
    local_f0._40_4_ = 1.0;
    local_f0._24_8_ = (long)(fVar4 - 9.223372e+18) & (long)fVar4 >> 0x3f | (long)fVar4;
    local_f0._32_8_ = (undefined8)((float)local_f0._44_4_ * fVar4);
    local_f0._32_8_ =
         (long)((float)local_f0._44_4_ * fVar4 - 9.223372e+18) & (long)local_f0._32_8_ >> 0x3f |
         local_f0._32_8_;
    local_f0[0x30] = false;
    local_170._M_dataplus._M_p = &DAT_3ff0000000000000;
    local_180.data_._0_4_ = 0x3f800000;
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_140,"1.0","ht.max_load_factor()",(double *)&local_170,
               (float *)&local_180);
    if ((char)local_140.first.ht == '\0') {
      testing::Message::Message((Message *)&local_170);
      pbVar2 = (pointer)0xafc493;
      if (local_140.first.pos.row_begin._M_current !=
          (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        pbVar2 = (local_140.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x282,(char *)pbVar2);
      testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
      }
    }
    iVar1._M_current = local_140.first.pos.row_begin._M_current;
    if (local_140.first.pos.row_begin._M_current !=
        (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((local_140.first.pos.row_begin._M_current)->group !=
          (pointer)&((local_140.first.pos.row_begin._M_current)->settings).
                    super_alloc_impl<Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                    .
                    super_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                    .count_) {
        operator_delete((local_140.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar1._M_current);
    }
    local_170._M_dataplus._M_p._0_4_ = (float)local_f0._44_4_;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_140,"shrink_threshold","ht.min_load_factor()",&local_144,
               (float *)&local_170);
    if ((char)local_140.first.ht == '\0') {
      testing::Message::Message((Message *)&local_170);
      pbVar2 = (pointer)0xafc493;
      if (local_140.first.pos.row_begin._M_current !=
          (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        pbVar2 = (local_140.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x283,(char *)pbVar2);
      testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
      }
    }
    iVar1._M_current = local_140.first.pos.row_begin._M_current;
    if (local_140.first.pos.row_begin._M_current !=
        (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((local_140.first.pos.row_begin._M_current)->group !=
          (pointer)&((local_140.first.pos.row_begin._M_current)->settings).
                    super_alloc_impl<Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                    .
                    super_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                    .count_) {
        operator_delete((local_140.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar1._M_current);
    }
    local_150 = local_48;
    iVar3 = 3;
    while( true ) {
      HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueKey((key_type *)&local_140,
                  (HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   *)this,iVar3 + -1);
      google::
      sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
      ::erase(this_00,(key_type *)&local_140);
      if ((iterator *)CONCAT44(local_140.first.ht._4_4_,local_140.first.ht._0_4_) !=
          &local_140.first.pos.row_end) {
        operator_delete((undefined1 *)CONCAT44(local_140.first.ht._4_4_,local_140.first.ht._0_4_));
      }
      HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueKey((key_type *)&local_140,
                  (HashtableTest<google::HashtableInterface_SparseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   *)this,iVar3);
      google::
      sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
      ::erase(this_00,(key_type *)&local_140);
      if ((iterator *)CONCAT44(local_140.first.ht._4_4_,local_140.first.ht._0_4_) !=
          &local_140.first.pos.row_end) {
        operator_delete((undefined1 *)CONCAT44(local_140.first.ht._4_4_,local_140.first.ht._0_4_));
      }
      UniqueObjectHelper<std::__cxx11::string>(&local_170,iVar3);
      google::
      sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
      ::resize_delta(this_00,1);
      google::
      sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
      ::insert_noresize(&local_140,this_00,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if ((float)(local_40 - local_88) / (float)local_150 <= local_144) break;
      local_170._M_dataplus._M_p = (pointer)local_48;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_140,"bucket_count","ht.bucket_count()",
                 (unsigned_long *)&local_150,(unsigned_long *)&local_170);
      if ((char)local_140.first.ht == '\0') {
        testing::Message::Message((Message *)&local_170);
        pbVar2 = (pointer)0xafc493;
        if (local_140.first.pos.row_begin._M_current !=
            (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
             *)0x0) {
          pbVar2 = (local_140.first.pos.row_begin._M_current)->group;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x28e,(char *)pbVar2);
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
        }
      }
      iVar1._M_current = local_140.first.pos.row_begin._M_current;
      if (local_140.first.pos.row_begin._M_current !=
          (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        if ((local_140.first.pos.row_begin._M_current)->group !=
            (pointer)&((local_140.first.pos.row_begin._M_current)->settings).
                      super_alloc_impl<Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                      .
                      super_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                      .count_) {
          operator_delete((local_140.first.pos.row_begin._M_current)->group);
        }
        operator_delete(iVar1._M_current);
      }
      iVar3 = iVar3 + 1;
    }
    local_170._M_dataplus._M_p = (pointer)local_48;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_140,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_170
               ,(unsigned_long *)&local_150);
    if ((char)local_140.first.ht == '\0') {
      testing::Message::Message((Message *)&local_170);
      pbVar2 = (pointer)0xafc493;
      if (local_140.first.pos.row_begin._M_current !=
          (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        pbVar2 = (local_140.first.pos.row_begin._M_current)->group;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x290,(char *)pbVar2);
      testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
      }
    }
    iVar1._M_current = local_140.first.pos.row_begin._M_current;
    if (local_140.first.pos.row_begin._M_current !=
        (sparsegroup<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(unsigned_short)48,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((local_140.first.pos.row_begin._M_current)->group !=
          (pointer)&((local_140.first.pos.row_begin._M_current)->settings).
                    super_alloc_impl<Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                    .
                    super_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
                    .count_) {
        operator_delete((local_140.first.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar1._M_current);
    }
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::~BaseHashtableInterface
              ((BaseHashtableInterface<google::sparse_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                *)local_f0);
    local_174 = local_174 + 0.2;
  } while (local_174 <= 0.8);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}